

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O2

vector<cali::StringConverter,_std::allocator<cali::StringConverter>_> * __thiscall
cali::StringConverter::rec_list
          (vector<cali::StringConverter,_std::allocator<cali::StringConverter>_>
           *__return_storage_ptr__,StringConverter *this,bool *okptr)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *separators;
  byte bVar4;
  byte bVar5;
  char in_R8B;
  string str;
  string local_1d0;
  istringstream is;
  int aiStack_190 [88];
  
  (__return_storage_ptr__->
  super__Vector_base<cali::StringConverter,_std::allocator<cali::StringConverter>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cali::StringConverter,_std::allocator<cali::StringConverter>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cali::StringConverter,_std::allocator<cali::StringConverter>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)this,_S_in);
  cVar1 = util::read_char((istream *)&is);
  if ((cVar1 != '[') && (*(int *)((long)aiStack_190 + *(long *)(_is + -0x18)) == 0)) {
    std::istream::unget();
  }
  bVar4 = 0;
  do {
    cVar2 = util::read_char((istream *)&is);
    separators = &str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    str._M_dataplus._M_p = (pointer)separators;
    if (cVar2 == '[') {
      std::__cxx11::string::assign((char *)&str);
      util::read_nested_text_abi_cxx11_(&local_1d0,(util *)&is,(istream *)0x5b,']',in_R8B);
      std::__cxx11::string::append((string *)&str);
      std::__cxx11::string::~string((string *)&local_1d0);
      cVar2 = util::read_char((istream *)&is);
      if (cVar2 == ']') goto LAB_001be269;
LAB_001be2bb:
      bVar4 = 1;
      bVar3 = false;
    }
    else {
      if (cVar2 == '{') {
        std::__cxx11::string::assign((char *)&str);
        util::read_nested_text_abi_cxx11_(&local_1d0,(util *)&is,(istream *)0x7b,'}',in_R8B);
        std::__cxx11::string::append((string *)&str);
        std::__cxx11::string::~string((string *)&local_1d0);
        cVar2 = util::read_char((istream *)&is);
        if (cVar2 != '}') goto LAB_001be2bb;
LAB_001be269:
        std::__cxx11::string::append((char *)&str);
      }
      else {
        std::istream::unget();
        util::read_word_abi_cxx11_(&local_1d0,(util *)&is,(istream *)",]",separators->_M_local_buf);
        std::__cxx11::string::operator=((string *)&str,(string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
      }
      if (str._M_string_length != 0) {
        std::__cxx11::string::string((string *)&local_1d0,(string *)&str);
        std::vector<cali::StringConverter,_std::allocator<cali::StringConverter>_>::
        emplace_back<cali::StringConverter>(__return_storage_ptr__,(StringConverter *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
      }
      cVar2 = util::read_char((istream *)&is);
      bVar3 = true;
    }
    std::__cxx11::string::~string((string *)&str);
    if (((!bVar3) || (*(int *)((long)aiStack_190 + *(long *)(_is + -0x18)) != 0)) ||
       (bVar3 = util::is_one_of(cVar2,","), !bVar3)) {
      if (cVar1 == '[') {
        bVar5 = 1;
        if (cVar2 == ']') {
          bVar5 = bVar4;
        }
      }
      else {
        std::istream::unget();
        bVar5 = bVar4;
      }
      if (okptr != (bool *)0x0) {
        *okptr = (bool)(~bVar5 & 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&is);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::vector<cali::StringConverter> cali::StringConverter::rec_list(bool* okptr) const
{
    std::vector<StringConverter> ret;
    bool                         error = false;
    char                         c;

    std::istringstream is(m_str);

    int d = 0;
    c     = util::read_char(is);

    if (c == '[')
        ++d;
    else if (is.good())
        is.unget();

    do {
        c = util::read_char(is);
        std::string str;

        if (c == '{') {
            str = "{";
            str.append(util::read_nested_text(is, '{', '}'));

            c = util::read_char(is);
            if (c != '}') {
                error = true;
                break;
            }

            str.append("}");
        } else if (c == '[') {
            str = "[";
            str.append(util::read_nested_text(is, '[', ']'));

            c = util::read_char(is);
            if (c != ']') {
                error = true;
                break;
            }
            str.append("]");
        } else {
            is.unget();
            str = util::read_word(is, ",]");
        }

        if (!str.empty())
            ret.push_back(StringConverter(str));

        c = util::read_char(is);
    } while (is.good() && util::is_one_of(c, ","));

    if (d > 0) {
        if (c != ']')
            error = true;
    } else
        is.unget();

    if (okptr)
        *okptr = !error;

    return ret;
}